

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aes.cpp
# Opt level: O1

int mbedtls_aes_setkey_dec(mbedtls_aes_context *ctx,uchar *key,uint keybits)

{
  uint uVar1;
  int iVar2;
  undefined8 uVar3;
  int iVar4;
  uint32_t *puVar5;
  ulong uVar6;
  uint32_t *puVar7;
  uint32_t *puVar8;
  long lVar9;
  uint32_t *puVar10;
  long lVar11;
  mbedtls_aes_context cty;
  mbedtls_aes_context local_150;
  
  memset(&local_150,0,0x120);
  ctx->rk_offset = 0;
  iVar4 = mbedtls_aes_setkey_enc(&local_150,key,keybits);
  if (iVar4 == 0) {
    uVar6 = (ulong)local_150.nr;
    ctx->nr = local_150.nr;
    puVar8 = local_150.buf + local_150.rk_offset + uVar6 * 4 + -4;
    puVar7 = ctx->buf + 4;
    uVar3 = *(undefined8 *)(local_150.buf + local_150.rk_offset + uVar6 * 4 + 2);
    *(undefined8 *)ctx->buf = *(undefined8 *)(local_150.buf + local_150.rk_offset + uVar6 * 4);
    *(undefined8 *)(ctx->buf + 2) = uVar3;
    if (1 < (long)uVar6) {
      do {
        puVar10 = puVar7;
        puVar5 = puVar8;
        lVar9 = 0;
        lVar11 = 0;
        do {
          uVar1 = puVar5[lVar11];
          puVar10[lVar11] =
               RT1[FSb[uVar1 >> 8 & 0xff]] ^ RT0[FSb[uVar1 & 0xff]] ^ RT2[FSb[uVar1 >> 0x10 & 0xff]]
               ^ RT3[FSb[uVar1 >> 0x18]];
          lVar11 = lVar11 + 1;
          lVar9 = lVar9 + -4;
        } while ((int)lVar11 != 4);
        iVar2 = (int)uVar6;
        uVar6 = (ulong)(iVar2 - 1);
        puVar8 = (uint32_t *)((long)puVar5 + (-0x20 - lVar9));
        puVar7 = (uint32_t *)((long)puVar10 - lVar9);
      } while (2 < iVar2);
      puVar7 = (uint32_t *)((long)puVar10 - lVar9);
      puVar8 = (uint32_t *)((long)puVar5 + (-0x20 - lVar9));
    }
    uVar3 = *(undefined8 *)(puVar8 + 2);
    *(undefined8 *)puVar7 = *(undefined8 *)puVar8;
    *(undefined8 *)(puVar7 + 2) = uVar3;
  }
  mbedtls_platform_zeroize(&local_150,0x120);
  return iVar4;
}

Assistant:

int mbedtls_aes_setkey_dec(mbedtls_aes_context *ctx, const unsigned char *key,
                           unsigned int keybits)
{
#if !defined(MBEDTLS_AES_USE_HARDWARE_ONLY)
    uint32_t *SK;
#endif
    int ret;
    mbedtls_aes_context cty;
    uint32_t *RK;


    mbedtls_aes_init(&cty);

    ctx->rk_offset = mbedtls_aes_rk_offset(ctx->buf);
    RK = ctx->buf + ctx->rk_offset;

    /* Also checks keybits */
    if ((ret = mbedtls_aes_setkey_enc(&cty, key, keybits)) != 0) {
        goto exit;
    }

    ctx->nr = cty.nr;

#if defined(MBEDTLS_AESNI_HAVE_CODE)
    if (mbedtls_aesni_has_support(MBEDTLS_AESNI_AES)) {
        mbedtls_aesni_inverse_key((unsigned char *) RK,
                                  (const unsigned char *) (cty.buf + cty.rk_offset), ctx->nr);
        goto exit;
    }
#endif

#if defined(MBEDTLS_AESCE_HAVE_CODE)
    if (MBEDTLS_AESCE_HAS_SUPPORT()) {
        mbedtls_aesce_inverse_key(
            (unsigned char *) RK,
            (const unsigned char *) (cty.buf + cty.rk_offset),
            ctx->nr);
        goto exit;
    }
#endif

#if !defined(MBEDTLS_AES_USE_HARDWARE_ONLY)
    SK = cty.buf + cty.rk_offset + cty.nr * 4;

    *RK++ = *SK++;
    *RK++ = *SK++;
    *RK++ = *SK++;
    *RK++ = *SK++;
    SK -= 8;
    for (int i = ctx->nr - 1; i > 0; i--, SK -= 8) {
        for (int j = 0; j < 4; j++, SK++) {
            *RK++ = AES_RT0(FSb[MBEDTLS_BYTE_0(*SK)]) ^
                    AES_RT1(FSb[MBEDTLS_BYTE_1(*SK)]) ^
                    AES_RT2(FSb[MBEDTLS_BYTE_2(*SK)]) ^
                    AES_RT3(FSb[MBEDTLS_BYTE_3(*SK)]);
        }
    }

    *RK++ = *SK++;
    *RK++ = *SK++;
    *RK++ = *SK++;
    *RK++ = *SK++;
#endif /* !MBEDTLS_AES_USE_HARDWARE_ONLY */
exit:
    mbedtls_aes_free(&cty);

    return ret;
}